

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.hpp
# Opt level: O0

void __thiscall
cppurses::detail::Timer_event_loop::Timer_event_loop
          (Timer_event_loop *this,
          function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func)

{
  function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func_local;
  Timer_event_loop *this_local;
  
  Event_loop::Event_loop(&this->super_Event_loop);
  (this->super_Event_loop)._vptr_Event_loop = (_func_int **)&PTR__Timer_event_loop_0028e9b0;
  std::set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>::
  set(&this->registered_widgets_);
  std::function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()>::function
            (&this->period_func_,period_func);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->last_time_);
  return;
}

Assistant:

explicit Timer_event_loop(std::function<Period_t()> period_func)
        : period_func_{period_func}
    {}